

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::occluded
               (vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  uint uVar1;
  vfloat<4> vVar2;
  uint uVar3;
  BVH *bvh;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  GridSOA *pGVar30;
  bool bVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  undefined8 uVar35;
  size_t sVar36;
  undefined4 uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  NodeRef root;
  size_t sVar42;
  ulong uVar43;
  long lVar44;
  uint uVar45;
  long lVar46;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar47;
  NodeRef *pNVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  undefined1 in_ZMM0 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar98;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar96;
  float fVar99;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar95;
  float fVar97;
  undefined1 auVar94 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar131;
  float fVar132;
  undefined1 auVar121 [16];
  float fVar133;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar157;
  float fVar158;
  undefined1 auVar141 [16];
  float fVar159;
  undefined1 auVar142 [16];
  float fVar160;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar161;
  float fVar176;
  float fVar178;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar179;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar189;
  float fVar190;
  float fVar202;
  float fVar203;
  undefined1 auVar191 [16];
  float fVar204;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar205;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar206;
  float fVar207;
  float fVar214;
  float fVar216;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar218;
  undefined1 auVar211 [16];
  float fVar215;
  float fVar217;
  float fVar219;
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  float fVar220;
  float fVar221;
  float fVar227;
  float fVar229;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar228;
  float fVar230;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar233;
  float fVar237;
  float fVar238;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar239;
  undefined1 auVar236 [64];
  float fVar240;
  undefined1 auVar241 [16];
  float fVar246;
  undefined1 auVar242 [16];
  float fVar244;
  float fVar245;
  undefined1 auVar243 [64];
  float fVar247;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar250 [64];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar256 [16];
  undefined1 local_1b98 [16];
  float local_1b88;
  float fStack_1b84;
  float fStack_1b80;
  undefined8 uStack_1b50;
  float local_1b48;
  float fStack_1b44;
  float fStack_1b40;
  undefined1 local_1b28 [16];
  RayK<4> *local_1b10;
  char *local_1b08;
  undefined4 local_1afc;
  undefined1 local_1af8 [16];
  vbool<4> terminated;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined8 uStack_1a50;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  uint local_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  uint uStack_1928;
  uint uStack_1924;
  uint uStack_1920;
  uint uStack_191c;
  TravRayK<4,_true> tray;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [8];
  float fStack_17c0;
  float fStack_17bc;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  undefined8 local_1748;
  undefined8 uStack_1740;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar224 [16];
  
  uVar29 = mm_lookupmask_ps._8_8_;
  uVar28 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar66 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar58 = vpcmpeqd_avx(auVar66,(undefined1  [16])valid_i->field_0);
    auVar100 = ZEXT816(0) << 0x40;
    auVar10 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar100,5);
    auVar139 = auVar58 & auVar10;
    if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar139 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar139 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar139[0xf] < '\0'
       ) {
      auVar10 = vandps_avx(auVar10,auVar58);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar231._8_4_ = 0x7fffffff;
      auVar231._0_8_ = 0x7fffffff7fffffff;
      auVar231._12_4_ = 0x7fffffff;
      auVar58 = vandps_avx(auVar231,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar208._8_4_ = 0x219392ef;
      auVar208._0_8_ = 0x219392ef219392ef;
      auVar208._12_4_ = 0x219392ef;
      auVar139 = vcmpps_avx(auVar58,auVar208,1);
      auVar234._8_4_ = 0x3f800000;
      auVar234._0_8_ = 0x3f8000003f800000;
      auVar234._12_4_ = 0x3f800000;
      auVar155 = vdivps_avx(auVar234,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar58 = vandps_avx(auVar231,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar141 = vcmpps_avx(auVar58,auVar208,1);
      auVar59 = vdivps_avx(auVar234,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar58 = vandps_avx(auVar231,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar58 = vcmpps_avx(auVar58,auVar208,1);
      auVar209._8_4_ = 0x5d5e0b6b;
      auVar209._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar209._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar155,auVar209,auVar139);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar59,auVar209,auVar141)
      ;
      auVar139 = vdivps_avx(auVar234,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar139,auVar209,auVar58)
      ;
      auVar58 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar100,1);
      auVar155._8_4_ = 0x10;
      auVar155._0_8_ = 0x1000000010;
      auVar155._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar58,auVar155);
      auVar58 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar100,5);
      auVar139._8_4_ = 0x20;
      auVar139._0_8_ = 0x2000000020;
      auVar139._12_4_ = 0x20;
      auVar59._8_4_ = 0x30;
      auVar59._0_8_ = 0x3000000030;
      auVar59._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar59,auVar139,auVar58)
      ;
      auVar58 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar100,5);
      auVar141._8_4_ = 0x40;
      auVar141._0_8_ = 0x4000000040;
      auVar141._12_4_ = 0x40;
      auVar162._8_4_ = 0x50;
      auVar162._0_8_ = 0x5000000050;
      auVar162._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar162,auVar141,auVar58);
      auVar58 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar100);
      auVar139 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar100);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar236 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar58,auVar10);
      auVar58._8_4_ = 0xff800000;
      auVar58._0_8_ = 0xff800000ff800000;
      auVar58._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar58,auVar139,auVar10);
      terminated.field_0.i[1] = auVar10._4_4_ ^ auVar66._4_4_;
      terminated.field_0.i[0] = auVar10._0_4_ ^ auVar66._0_4_;
      terminated.field_0.i[2] = auVar10._8_4_ ^ auVar66._8_4_;
      terminated.field_0.i[3] = auVar10._12_4_ ^ auVar66._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar45 = 3;
      }
      else {
        uVar45 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1b10 = ray + 0x80;
      pNVar48 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar47 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar250 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_015215a0:
      do {
        do {
          root.ptr = pNVar48[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01522c26;
          pNVar48 = pNVar48 + -1;
          paVar47 = paVar47 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar47->v;
          auVar94 = ZEXT1664((undefined1  [16])vVar2.field_0);
          auVar66 = vcmpps_avx((undefined1  [16])vVar2.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar32 = vmovmskps_avx(auVar66);
        } while (uVar32 == 0);
        uVar41 = (ulong)(uVar32 & 0xff);
        uVar32 = POPCOUNT(uVar32 & 0xff);
        if (uVar45 < uVar32) {
LAB_015215de:
          do {
            pGVar30 = pre.super_Precalculations.grid;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01522c26;
              auVar58 = auVar94._0_16_;
              auVar66 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar58,6);
              if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar66[0xf] < '\0') {
                if (((uint)root.ptr & 0xf) == 8) {
                  auVar66 = vpcmpeqd_avx(auVar66,auVar66);
                  auVar213 = ZEXT1664(auVar66 ^ (undefined1  [16])terminated.field_0);
                  uVar41 = (ulong)(pre.super_Precalculations.grid)->dim_offset;
                  uVar32 = (pre.super_Precalculations.grid)->width;
                  uVar3 = (pre.super_Precalculations.grid)->height;
                  uVar39 = (ulong)(pre.super_Precalculations.grid)->gridOffset;
                  lVar38 = uVar39 + uVar41 * 0xc;
                  uVar43 = root.ptr >> 4;
                  lVar46 = (ulong)uVar32 * 4;
                  lVar21 = uVar43 * 4 + uVar39 + uVar41 * 8 + 0x30;
                  lVar24 = uVar43 * 4 + uVar39 + uVar41 * 4 + 0x30;
                  lVar34 = uVar39 + uVar43 * 4 + 0x30;
                  uVar35 = CONCAT71((int7)((ulong)lVar34 >> 8),1);
                  lVar44 = 0;
                  do {
                    local_1afc = (undefined4)uVar35;
                    lVar40 = (lVar44 + 1) * lVar46;
                    lVar20 = lVar40 + uVar43 * 4 + lVar38 + 0x2c;
                    lVar22 = lVar40 + lVar21;
                    lVar25 = lVar40 + lVar24;
                    lVar40 = lVar40 + uVar39 + 0x2c + uVar43 * 4;
                    lVar44 = lVar44 * lVar46;
                    lVar27 = lVar44 + uVar43 * 4 + lVar38 + 0x30;
                    lVar23 = lVar44 + lVar21;
                    lVar26 = lVar44 + lVar24;
                    local_1b08 = pGVar30->data + lVar44 + lVar34 + -0x30;
                    lVar44 = 0;
                    do {
                      if ((ulong)((ulong)uVar32 != 2) * 4 + 4 == lVar44) break;
                      uVar37 = *(undefined4 *)(local_1b08 + lVar44 + -4);
                      auVar235._4_4_ = uVar37;
                      auVar235._0_4_ = uVar37;
                      auVar235._8_4_ = uVar37;
                      auVar235._12_4_ = uVar37;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar26 + -0x34);
                      auVar50._4_4_ = uVar37;
                      auVar50._0_4_ = uVar37;
                      auVar50._8_4_ = uVar37;
                      auVar50._12_4_ = uVar37;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar23 + -0x34);
                      auVar77._4_4_ = uVar37;
                      auVar77._0_4_ = uVar37;
                      auVar77._8_4_ = uVar37;
                      auVar77._12_4_ = uVar37;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar40 + -0x30);
                      auVar248._4_4_ = uVar37;
                      auVar248._0_4_ = uVar37;
                      auVar248._8_4_ = uVar37;
                      auVar248._12_4_ = uVar37;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar25 + -0x34);
                      auVar103._4_4_ = uVar37;
                      auVar103._0_4_ = uVar37;
                      auVar103._8_4_ = uVar37;
                      auVar103._12_4_ = uVar37;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar22 + -0x34);
                      auVar164._4_4_ = uVar37;
                      auVar164._0_4_ = uVar37;
                      auVar164._8_4_ = uVar37;
                      auVar164._12_4_ = uVar37;
                      auVar66 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar58 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar141 = vsubps_avx(auVar50,auVar66);
                      auVar155 = vsubps_avx(auVar77,auVar58);
                      auVar59 = vsubps_avx(auVar103,auVar66);
                      auVar162 = vsubps_avx(auVar164,auVar58);
                      auVar139 = vsubps_avx(auVar59,auVar141);
                      auVar208 = vsubps_avx(auVar162,auVar155);
                      fVar6 = auVar141._0_4_;
                      fVar161 = auVar59._0_4_ + fVar6;
                      fVar8 = auVar141._4_4_;
                      fVar176 = auVar59._4_4_ + fVar8;
                      fVar99 = auVar141._8_4_;
                      fVar178 = auVar59._8_4_ + fVar99;
                      fVar9 = auVar141._12_4_;
                      fVar179 = auVar59._12_4_ + fVar9;
                      fVar7 = auVar155._0_4_;
                      fVar189 = auVar162._0_4_ + fVar7;
                      fVar96 = auVar155._4_4_;
                      fVar202 = auVar162._4_4_ + fVar96;
                      fVar177 = auVar155._8_4_;
                      fVar203 = auVar162._8_4_ + fVar177;
                      fVar190 = auVar155._12_4_;
                      fVar204 = auVar162._12_4_ + fVar190;
                      auVar100 = auVar213._0_16_;
                      fVar49 = auVar208._0_4_;
                      auVar210._0_4_ = fVar161 * fVar49;
                      fVar205 = auVar208._4_4_;
                      auVar210._4_4_ = fVar176 * fVar205;
                      fVar11 = auVar208._8_4_;
                      auVar210._8_4_ = fVar178 * fVar11;
                      fVar12 = auVar208._12_4_;
                      auVar210._12_4_ = fVar179 * fVar12;
                      fVar68 = auVar139._0_4_;
                      auVar223._0_4_ = fVar189 * fVar68;
                      fVar207 = auVar139._4_4_;
                      auVar223._4_4_ = fVar202 * fVar207;
                      fVar217 = auVar139._8_4_;
                      auVar223._8_4_ = fVar203 * fVar217;
                      fVar13 = auVar139._12_4_;
                      auVar223._12_4_ = fVar204 * fVar13;
                      auVar208 = vsubps_avx(auVar223,auVar210);
                      auVar139 = *(undefined1 (*) [16])ray;
                      auVar209 = vsubps_avx(auVar235,auVar139);
                      auVar231 = vsubps_avx(auVar248,auVar139);
                      auVar234 = vsubps_avx(auVar231,auVar209);
                      fVar69 = auVar234._0_4_;
                      auVar192._0_4_ = fVar189 * fVar69;
                      fVar215 = auVar234._4_4_;
                      auVar192._4_4_ = fVar202 * fVar215;
                      fVar219 = auVar234._8_4_;
                      auVar192._8_4_ = fVar203 * fVar219;
                      fVar14 = auVar234._12_4_;
                      auVar192._12_4_ = fVar204 * fVar14;
                      fVar189 = auVar209._0_4_;
                      fVar220 = auVar231._0_4_ + fVar189;
                      fVar202 = auVar209._4_4_;
                      fVar227 = auVar231._4_4_ + fVar202;
                      fVar203 = auVar209._8_4_;
                      fVar229 = auVar231._8_4_ + fVar203;
                      fVar204 = auVar209._12_4_;
                      fVar230 = auVar231._12_4_ + fVar204;
                      auVar249._0_4_ = fVar220 * fVar49;
                      auVar249._4_4_ = fVar227 * fVar205;
                      auVar249._8_4_ = fVar229 * fVar11;
                      auVar249._12_4_ = fVar230 * fVar12;
                      auVar234 = vsubps_avx(auVar249,auVar192);
                      auVar193._0_4_ = fVar220 * fVar68;
                      auVar193._4_4_ = fVar227 * fVar207;
                      auVar193._8_4_ = fVar229 * fVar217;
                      auVar193._12_4_ = fVar230 * fVar13;
                      auVar165._0_4_ = fVar69 * fVar161;
                      auVar165._4_4_ = fVar215 * fVar176;
                      auVar165._8_4_ = fVar219 * fVar178;
                      auVar165._12_4_ = fVar14 * fVar179;
                      auVar15 = vsubps_avx(auVar165,auVar193);
                      auVar17 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar179 = *(float *)(ray + 0x6c);
                      fVar220 = *(float *)(ray + 0x50);
                      fVar227 = *(float *)(ray + 0x54);
                      fVar229 = *(float *)(ray + 0x58);
                      auVar18 = *(undefined1 (*) [12])(ray + 0x50);
                      fVar230 = *(float *)(ray + 0x5c);
                      fVar255 = *(float *)(ray + 0x40);
                      fVar257 = *(float *)(ray + 0x44);
                      fVar258 = *(float *)(ray + 0x48);
                      auVar19 = *(undefined1 (*) [12])(ray + 0x40);
                      fVar259 = *(float *)(ray + 0x4c);
                      fVar221 = auVar208._0_4_ * fVar255 +
                                auVar15._0_4_ * *(float *)(ray + 0x60) + fVar220 * auVar234._0_4_;
                      fVar228 = auVar208._4_4_ * fVar257 +
                                auVar15._4_4_ * *(float *)(ray + 100) + fVar227 * auVar234._4_4_;
                      auVar224._0_8_ = CONCAT44(fVar228,fVar221);
                      auVar224._8_4_ =
                           auVar208._8_4_ * fVar258 +
                           auVar15._8_4_ * *(float *)(ray + 0x68) + fVar229 * auVar234._8_4_;
                      auVar224._12_4_ =
                           auVar208._12_4_ * fVar259 +
                           auVar15._12_4_ * fVar179 + fVar230 * auVar234._12_4_;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar26 + -0x30);
                      auVar51._4_4_ = uVar37;
                      auVar51._0_4_ = uVar37;
                      auVar51._8_4_ = uVar37;
                      auVar51._12_4_ = uVar37;
                      auVar66 = vsubps_avx(auVar51,auVar66);
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar23 + -0x30);
                      auVar78._4_4_ = uVar37;
                      auVar78._0_4_ = uVar37;
                      auVar78._8_4_ = uVar37;
                      auVar78._12_4_ = uVar37;
                      auVar58 = vsubps_avx(auVar78,auVar58);
                      auVar141 = vsubps_avx(auVar141,auVar66);
                      auVar155 = vsubps_avx(auVar155,auVar58);
                      fVar180 = fVar6 + auVar66._0_4_;
                      fVar186 = fVar8 + auVar66._4_4_;
                      fVar187 = fVar99 + auVar66._8_4_;
                      fVar188 = fVar9 + auVar66._12_4_;
                      fVar161 = fVar7 + auVar58._0_4_;
                      fVar176 = fVar96 + auVar58._4_4_;
                      fVar178 = fVar177 + auVar58._8_4_;
                      fVar159 = fVar190 + auVar58._12_4_;
                      fVar247 = auVar155._0_4_;
                      auVar241._0_4_ = fVar247 * fVar180;
                      fVar251 = auVar155._4_4_;
                      auVar241._4_4_ = fVar251 * fVar186;
                      fVar252 = auVar155._8_4_;
                      auVar241._8_4_ = fVar252 * fVar187;
                      fVar253 = auVar155._12_4_;
                      auVar241._12_4_ = fVar253 * fVar188;
                      fVar120 = auVar141._0_4_;
                      auVar166._0_4_ = fVar120 * fVar161;
                      fVar131 = auVar141._4_4_;
                      auVar166._4_4_ = fVar131 * fVar176;
                      fVar132 = auVar141._8_4_;
                      auVar166._8_4_ = fVar132 * fVar178;
                      fVar133 = auVar141._12_4_;
                      auVar166._12_4_ = fVar133 * fVar159;
                      auVar141 = vsubps_avx(auVar166,auVar241);
                      uVar37 = *(undefined4 *)(local_1b08 + lVar44);
                      auVar194._4_4_ = uVar37;
                      auVar194._0_4_ = uVar37;
                      auVar194._8_4_ = uVar37;
                      auVar194._12_4_ = uVar37;
                      auVar139 = vsubps_avx(auVar194,auVar139);
                      auVar155 = vsubps_avx(auVar209,auVar139);
                      fVar240 = auVar155._0_4_;
                      auVar142._0_4_ = fVar240 * fVar161;
                      fVar244 = auVar155._4_4_;
                      auVar142._4_4_ = fVar244 * fVar176;
                      fVar245 = auVar155._8_4_;
                      auVar142._8_4_ = fVar245 * fVar178;
                      fVar246 = auVar155._12_4_;
                      auVar142._12_4_ = fVar246 * fVar159;
                      fVar161 = auVar139._0_4_ + fVar189;
                      fVar176 = auVar139._4_4_ + fVar202;
                      fVar178 = auVar139._8_4_ + fVar203;
                      fVar159 = auVar139._12_4_ + fVar204;
                      auVar195._0_4_ = fVar161 * fVar247;
                      auVar195._4_4_ = fVar176 * fVar251;
                      auVar195._8_4_ = fVar178 * fVar252;
                      auVar195._12_4_ = fVar159 * fVar253;
                      auVar155 = vsubps_avx(auVar195,auVar142);
                      auVar196._0_4_ = fVar161 * fVar120;
                      auVar196._4_4_ = fVar176 * fVar131;
                      auVar196._8_4_ = fVar178 * fVar132;
                      auVar196._12_4_ = fVar159 * fVar133;
                      auVar181._0_4_ = fVar240 * fVar180;
                      auVar181._4_4_ = fVar244 * fVar186;
                      auVar181._8_4_ = fVar245 * fVar187;
                      auVar181._12_4_ = fVar246 * fVar188;
                      auVar208 = vsubps_avx(auVar181,auVar196);
                      fVar161 = auVar17._0_4_;
                      fVar176 = auVar17._4_4_;
                      fVar178 = auVar17._8_4_;
                      auVar182._0_4_ =
                           fVar255 * auVar141._0_4_ +
                           auVar208._0_4_ * fVar161 + fVar220 * auVar155._0_4_;
                      auVar182._4_4_ =
                           fVar257 * auVar141._4_4_ +
                           auVar208._4_4_ * fVar176 + fVar227 * auVar155._4_4_;
                      auVar182._8_4_ =
                           fVar258 * auVar141._8_4_ +
                           auVar208._8_4_ * fVar178 + fVar229 * auVar155._8_4_;
                      auVar182._12_4_ =
                           fVar259 * auVar141._12_4_ +
                           auVar208._12_4_ * fVar179 + fVar230 * auVar155._12_4_;
                      auVar141 = vsubps_avx(auVar139,auVar231);
                      fVar140 = auVar139._0_4_ + auVar231._0_4_;
                      fVar157 = auVar139._4_4_ + auVar231._4_4_;
                      fVar158 = auVar139._8_4_ + auVar231._8_4_;
                      fVar160 = auVar139._12_4_ + auVar231._12_4_;
                      auVar139 = vsubps_avx(auVar66,auVar59);
                      fVar159 = auVar66._0_4_ + auVar59._0_4_;
                      fVar180 = auVar66._4_4_ + auVar59._4_4_;
                      fVar186 = auVar66._8_4_ + auVar59._8_4_;
                      fVar187 = auVar66._12_4_ + auVar59._12_4_;
                      auVar66 = vsubps_avx(auVar58,auVar162);
                      fVar188 = auVar58._0_4_ + auVar162._0_4_;
                      fVar95 = auVar58._4_4_ + auVar162._4_4_;
                      fVar97 = auVar58._8_4_ + auVar162._8_4_;
                      fVar98 = auVar58._12_4_ + auVar162._12_4_;
                      fVar206 = auVar66._0_4_;
                      auVar104._0_4_ = fVar206 * fVar159;
                      fVar214 = auVar66._4_4_;
                      auVar104._4_4_ = fVar214 * fVar180;
                      fVar216 = auVar66._8_4_;
                      auVar104._8_4_ = fVar216 * fVar186;
                      fVar218 = auVar66._12_4_;
                      auVar104._12_4_ = fVar218 * fVar187;
                      fVar233 = auVar139._0_4_;
                      auVar167._0_4_ = fVar233 * fVar188;
                      fVar237 = auVar139._4_4_;
                      auVar167._4_4_ = fVar237 * fVar95;
                      fVar238 = auVar139._8_4_;
                      auVar167._8_4_ = fVar238 * fVar97;
                      fVar239 = auVar139._12_4_;
                      auVar167._12_4_ = fVar239 * fVar98;
                      auVar66 = vsubps_avx(auVar167,auVar104);
                      fVar254 = auVar141._0_4_;
                      auVar79._0_4_ = fVar254 * fVar188;
                      fVar188 = auVar141._4_4_;
                      auVar79._4_4_ = fVar188 * fVar95;
                      fVar95 = auVar141._8_4_;
                      auVar79._8_4_ = fVar95 * fVar97;
                      fVar97 = auVar141._12_4_;
                      auVar79._12_4_ = fVar97 * fVar98;
                      auVar168._0_4_ = fVar206 * fVar140;
                      auVar168._4_4_ = fVar214 * fVar157;
                      auVar168._8_4_ = fVar216 * fVar158;
                      auVar168._12_4_ = fVar218 * fVar160;
                      auVar58 = vsubps_avx(auVar168,auVar79);
                      auVar169._8_4_ = 0x7fffffff;
                      auVar169._0_8_ = 0x7fffffff7fffffff;
                      auVar169._12_4_ = 0x7fffffff;
                      auVar143._0_4_ = fVar233 * fVar140;
                      auVar143._4_4_ = fVar237 * fVar157;
                      auVar143._8_4_ = fVar238 * fVar158;
                      auVar143._12_4_ = fVar239 * fVar160;
                      auVar52._0_4_ = fVar254 * fVar159;
                      auVar52._4_4_ = fVar188 * fVar180;
                      auVar52._8_4_ = fVar95 * fVar186;
                      auVar52._12_4_ = fVar97 * fVar187;
                      auVar139 = vsubps_avx(auVar52,auVar143);
                      auVar53._0_4_ =
                           fVar255 * auVar66._0_4_ +
                           auVar139._0_4_ * fVar161 + fVar220 * auVar58._0_4_;
                      auVar53._4_4_ =
                           fVar257 * auVar66._4_4_ +
                           auVar139._4_4_ * fVar176 + fVar227 * auVar58._4_4_;
                      auVar53._8_4_ =
                           fVar258 * auVar66._8_4_ +
                           auVar139._8_4_ * fVar178 + fVar229 * auVar58._8_4_;
                      auVar53._12_4_ =
                           fVar259 * auVar66._12_4_ +
                           auVar139._12_4_ * fVar179 + fVar230 * auVar58._12_4_;
                      auVar135._0_4_ = auVar53._0_4_ + fVar221 + auVar182._0_4_;
                      auVar135._4_4_ = auVar53._4_4_ + fVar228 + auVar182._4_4_;
                      auVar135._8_4_ = auVar53._8_4_ + auVar224._8_4_ + auVar182._8_4_;
                      auVar135._12_4_ = auVar53._12_4_ + auVar224._12_4_ + auVar182._12_4_;
                      auVar66 = vandps_avx(auVar135,auVar169);
                      auVar80._0_4_ = auVar66._0_4_ * 1.1920929e-07;
                      auVar80._4_4_ = auVar66._4_4_ * 1.1920929e-07;
                      auVar80._8_4_ = auVar66._8_4_ * 1.1920929e-07;
                      auVar80._12_4_ = auVar66._12_4_ * 1.1920929e-07;
                      auVar66 = vminps_avx(auVar224,auVar182);
                      auVar66 = vminps_avx(auVar66,auVar53);
                      uVar41 = CONCAT44(auVar80._4_4_,auVar80._0_4_);
                      auVar144._0_8_ = uVar41 ^ 0x8000000080000000;
                      auVar144._8_4_ = -auVar80._8_4_;
                      auVar144._12_4_ = -auVar80._12_4_;
                      auVar66 = vcmpps_avx(auVar66,auVar144,5);
                      auVar58 = vmaxps_avx(auVar224,auVar182);
                      auVar58 = vmaxps_avx(auVar58,auVar53);
                      auVar58 = vcmpps_avx(auVar58,auVar80,2);
                      auVar66 = vorps_avx(auVar66,auVar58);
                      auVar58 = auVar100 & auVar66;
                      auVar66 = vandps_avx(auVar100,auVar66);
                      if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar58[0xf] < '\0') {
                        auVar54._0_4_ = fVar49 * fVar120;
                        auVar54._4_4_ = fVar205 * fVar131;
                        auVar54._8_4_ = fVar11 * fVar132;
                        auVar54._12_4_ = fVar12 * fVar133;
                        auVar81._0_4_ = fVar68 * fVar247;
                        auVar81._4_4_ = fVar207 * fVar251;
                        auVar81._8_4_ = fVar217 * fVar252;
                        auVar81._12_4_ = fVar13 * fVar253;
                        auVar141 = vsubps_avx(auVar81,auVar54);
                        auVar105._0_4_ = fVar233 * fVar247;
                        auVar105._4_4_ = fVar237 * fVar251;
                        auVar105._8_4_ = fVar238 * fVar252;
                        auVar105._12_4_ = fVar239 * fVar253;
                        auVar145._0_4_ = fVar206 * fVar120;
                        auVar145._4_4_ = fVar214 * fVar131;
                        auVar145._8_4_ = fVar216 * fVar132;
                        auVar145._12_4_ = fVar218 * fVar133;
                        auVar155 = vsubps_avx(auVar145,auVar105);
                        auVar58 = vandps_avx(auVar54,auVar169);
                        auVar139 = vandps_avx(auVar105,auVar169);
                        auVar58 = vcmpps_avx(auVar58,auVar139,1);
                        auVar141 = vblendvps_avx(auVar155,auVar141,auVar58);
                        auVar55._0_4_ = fVar240 * fVar206;
                        auVar55._4_4_ = fVar244 * fVar214;
                        auVar55._8_4_ = fVar245 * fVar216;
                        auVar55._12_4_ = fVar246 * fVar218;
                        auVar82._0_4_ = fVar240 * fVar49;
                        auVar82._4_4_ = fVar244 * fVar205;
                        auVar82._8_4_ = fVar245 * fVar11;
                        auVar82._12_4_ = fVar246 * fVar12;
                        auVar136._0_4_ = fVar69 * fVar247;
                        auVar136._4_4_ = fVar215 * fVar251;
                        auVar136._8_4_ = fVar219 * fVar252;
                        auVar136._12_4_ = fVar14 * fVar253;
                        auVar155 = vsubps_avx(auVar82,auVar136);
                        auVar146._0_4_ = fVar254 * fVar247;
                        auVar146._4_4_ = fVar188 * fVar251;
                        auVar146._8_4_ = fVar95 * fVar252;
                        auVar146._12_4_ = fVar97 * fVar253;
                        auVar59 = vsubps_avx(auVar146,auVar55);
                        auVar58 = vandps_avx(auVar136,auVar169);
                        auVar139 = vandps_avx(auVar55,auVar169);
                        auVar58 = vcmpps_avx(auVar58,auVar139,1);
                        auVar155 = vblendvps_avx(auVar59,auVar155,auVar58);
                        auVar56._0_4_ = fVar254 * fVar120;
                        auVar56._4_4_ = fVar188 * fVar131;
                        auVar56._8_4_ = fVar95 * fVar132;
                        auVar56._12_4_ = fVar97 * fVar133;
                        auVar83._0_4_ = fVar69 * fVar120;
                        auVar83._4_4_ = fVar215 * fVar131;
                        auVar83._8_4_ = fVar219 * fVar132;
                        auVar83._12_4_ = fVar14 * fVar133;
                        auVar147._0_4_ = fVar240 * fVar68;
                        auVar147._4_4_ = fVar244 * fVar207;
                        auVar147._8_4_ = fVar245 * fVar217;
                        auVar147._12_4_ = fVar246 * fVar13;
                        auVar170._0_4_ = fVar240 * fVar233;
                        auVar170._4_4_ = fVar244 * fVar237;
                        auVar170._8_4_ = fVar245 * fVar238;
                        auVar170._12_4_ = fVar246 * fVar239;
                        auVar59 = vsubps_avx(auVar83,auVar147);
                        auVar162 = vsubps_avx(auVar170,auVar56);
                        auVar58 = vandps_avx(auVar169,auVar147);
                        auVar139 = vandps_avx(auVar169,auVar56);
                        auVar58 = vcmpps_avx(auVar58,auVar139,1);
                        auVar139 = vblendvps_avx(auVar162,auVar59,auVar58);
                        local_1b88 = auVar18._0_4_;
                        fStack_1b84 = auVar18._4_4_;
                        fStack_1b80 = auVar18._8_4_;
                        local_1b48 = auVar19._0_4_;
                        fStack_1b44 = auVar19._4_4_;
                        fStack_1b40 = auVar19._8_4_;
                        fVar49 = auVar141._0_4_ * local_1b48 +
                                 auVar139._0_4_ * fVar161 + auVar155._0_4_ * local_1b88;
                        fVar68 = auVar141._4_4_ * fStack_1b44 +
                                 auVar139._4_4_ * fVar176 + auVar155._4_4_ * fStack_1b84;
                        fVar69 = auVar141._8_4_ * fStack_1b40 +
                                 auVar139._8_4_ * fVar178 + auVar155._8_4_ * fStack_1b80;
                        fVar161 = auVar141._12_4_ * fVar259 +
                                  auVar139._12_4_ * fVar179 + auVar155._12_4_ * fVar230;
                        auVar57._0_4_ = fVar49 + fVar49;
                        auVar57._4_4_ = fVar68 + fVar68;
                        auVar57._8_4_ = fVar69 + fVar69;
                        auVar57._12_4_ = fVar161 + fVar161;
                        fVar49 = auVar141._0_4_ * fVar189 +
                                 auVar139._0_4_ * fVar7 + auVar155._0_4_ * fVar6;
                        fVar96 = auVar141._4_4_ * fVar202 +
                                 auVar139._4_4_ * fVar96 + auVar155._4_4_ * fVar8;
                        fVar202 = auVar141._8_4_ * fVar203 +
                                  auVar139._8_4_ * fVar177 + auVar155._8_4_ * fVar99;
                        fVar99 = auVar141._12_4_ * fVar204 +
                                 auVar139._12_4_ * fVar190 + auVar155._12_4_ * fVar9;
                        auVar58 = vrcpps_avx(auVar57);
                        fVar6 = auVar58._0_4_;
                        auVar171._0_4_ = auVar57._0_4_ * fVar6;
                        fVar7 = auVar58._4_4_;
                        auVar171._4_4_ = auVar57._4_4_ * fVar7;
                        fVar189 = auVar58._8_4_;
                        auVar171._8_4_ = auVar57._8_4_ * fVar189;
                        fVar8 = auVar58._12_4_;
                        auVar171._12_4_ = auVar57._12_4_ * fVar8;
                        auVar197._8_4_ = 0x3f800000;
                        auVar197._0_8_ = 0x3f8000003f800000;
                        auVar197._12_4_ = 0x3f800000;
                        auVar58 = vsubps_avx(auVar197,auVar171);
                        auVar84._0_4_ = (fVar49 + fVar49) * (fVar6 + fVar6 * auVar58._0_4_);
                        auVar84._4_4_ = (fVar96 + fVar96) * (fVar7 + fVar7 * auVar58._4_4_);
                        auVar84._8_4_ = (fVar202 + fVar202) * (fVar189 + fVar189 * auVar58._8_4_);
                        auVar84._12_4_ = (fVar99 + fVar99) * (fVar8 + fVar8 * auVar58._12_4_);
                        auVar58 = vcmpps_avx(auVar84,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar59 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar84,2);
                        auVar58 = vandps_avx(auVar59,auVar58);
                        auVar59 = vcmpps_avx(auVar57,_DAT_01f7aa10,4);
                        auVar58 = vandps_avx(auVar59,auVar58);
                        auVar58 = vpslld_avx(auVar58,0x1f);
                        auVar59 = vpsrad_avx(auVar58,0x1f);
                        auVar58 = auVar66 & auVar59;
                        auVar66 = vandps_avx(auVar59,auVar66);
                        if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar58[0xf] < '\0') {
                          uStack_1a50 = auVar224._8_8_;
                          uStack_1740 = uStack_1a50;
                          local_17a8 = auVar139;
                          local_1798 = auVar155;
                          local_1788 = auVar141;
                          local_1778 = auVar84;
                          local_1768 = auVar135;
                          _local_1758 = auVar182;
                          local_1748 = auVar224._0_8_;
                        }
                      }
                      auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar250 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar40 + -0x2c);
                      local_1af8._4_4_ = uVar37;
                      local_1af8._0_4_ = uVar37;
                      local_1af8._8_4_ = uVar37;
                      local_1af8._12_4_ = uVar37;
                      local_1b98._4_4_ = *(undefined4 *)(pGVar30->data + lVar44 + lVar25 + -0x30);
                      local_1b98._0_4_ = local_1b98._4_4_;
                      local_1b98._8_4_ = local_1b98._4_4_;
                      local_1b98._12_4_ = local_1b98._4_4_;
                      uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar22 + -0x30);
                      auVar106._4_4_ = uVar37;
                      auVar106._0_4_ = uVar37;
                      auVar106._8_4_ = uVar37;
                      auVar106._12_4_ = uVar37;
                      pGVar4 = (context->scene->geometries).items
                               [(pre.super_Precalculations.grid)->_geomID].ptr;
                      uVar1 = pGVar4->mask;
                      auVar85._4_4_ = uVar1;
                      auVar85._0_4_ = uVar1;
                      auVar85._8_4_ = uVar1;
                      auVar85._12_4_ = uVar1;
                      auVar58 = vandps_avx(auVar85,*(undefined1 (*) [16])(ray + 0x90));
                      auVar58 = vpcmpeqd_avx(auVar58,_DAT_01f7aa10);
                      auVar94 = ZEXT1664(auVar58);
                      auVar139 = auVar66 & ~auVar58;
                      auVar141 = local_1af8;
                      if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar139 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar139 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar139[0xf] < '\0') {
                        auVar66 = vandnps_avx(auVar58,auVar66);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar58 = vandps_avx(auVar169,local_1768);
                          auVar139 = vrcpps_avx(local_1768);
                          fVar6 = auVar139._0_4_;
                          auVar125._0_4_ = local_1768._0_4_ * fVar6;
                          fVar7 = auVar139._4_4_;
                          auVar125._4_4_ = local_1768._4_4_ * fVar7;
                          fVar189 = auVar139._8_4_;
                          auVar125._8_4_ = local_1768._8_4_ * fVar189;
                          fVar8 = auVar139._12_4_;
                          auVar125._12_4_ = local_1768._12_4_ * fVar8;
                          auVar174._8_4_ = 0x3f800000;
                          auVar174._0_8_ = 0x3f8000003f800000;
                          auVar174._12_4_ = 0x3f800000;
                          auVar139 = vsubps_avx(auVar174,auVar125);
                          auVar113._0_4_ = fVar6 + fVar6 * auVar139._0_4_;
                          auVar113._4_4_ = fVar7 + fVar7 * auVar139._4_4_;
                          auVar113._8_4_ = fVar189 + fVar189 * auVar139._8_4_;
                          auVar113._12_4_ = fVar8 + fVar8 * auVar139._12_4_;
                          auVar126._8_4_ = 0x219392ef;
                          auVar126._0_8_ = 0x219392ef219392ef;
                          auVar126._12_4_ = 0x219392ef;
                          auVar58 = vcmpps_avx(auVar58,auVar126,5);
                          auVar58 = vandps_avx(auVar58,auVar113);
                          auVar91._0_4_ = auVar58._0_4_ * (float)local_1748;
                          auVar91._4_4_ = auVar58._4_4_ * local_1748._4_4_;
                          auVar91._8_4_ = auVar58._8_4_ * (float)uStack_1740;
                          auVar91._12_4_ = auVar58._12_4_ * uStack_1740._4_4_;
                          auVar162 = vminps_avx(auVar91,auVar174);
                          auVar114._0_4_ = auVar58._0_4_ * (float)local_1758._0_4_;
                          auVar114._4_4_ = auVar58._4_4_ * (float)local_1758._4_4_;
                          auVar114._8_4_ = auVar58._8_4_ * fStack_1750;
                          auVar114._12_4_ = auVar58._12_4_ * fStack_174c;
                          auVar208 = vminps_avx(auVar114,auVar174);
                          uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar27 + -0x34);
                          auVar127._4_4_ = uVar37;
                          auVar127._0_4_ = uVar37;
                          auVar127._8_4_ = uVar37;
                          auVar127._12_4_ = uVar37;
                          auVar139 = vpsrld_avx(auVar127,0x10);
                          auVar59 = ZEXT816(0) << 0x20;
                          auVar58 = vpblendw_avx(auVar127,auVar59,0xaa);
                          auVar58 = vcvtdq2ps_avx(auVar58);
                          auVar139 = vcvtdq2ps_avx(auVar139);
                          uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar20 + -0x30);
                          auVar152._4_4_ = uVar37;
                          auVar152._0_4_ = uVar37;
                          auVar152._8_4_ = uVar37;
                          auVar152._12_4_ = uVar37;
                          auVar141 = vsubps_avx(auVar174,auVar162);
                          auVar209 = vsubps_avx(auVar141,auVar208);
                          auVar141 = vpblendw_avx(auVar152,auVar59,0xaa);
                          auVar141 = vcvtdq2ps_avx(auVar141);
                          auVar155 = vpsrld_avx(auVar152,0x10);
                          auVar155 = vcvtdq2ps_avx(auVar155);
                          uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar27 + -0x30);
                          auVar153._4_4_ = uVar37;
                          auVar153._0_4_ = uVar37;
                          auVar153._8_4_ = uVar37;
                          auVar153._12_4_ = uVar37;
                          auVar59 = vpblendw_avx(auVar153,auVar59,0xaa);
                          auVar59 = vcvtdq2ps_avx(auVar59);
                          local_1978 = auVar162._0_4_ * auVar59._0_4_ * 0.00012207031 +
                                       auVar209._0_4_ * auVar58._0_4_ * 0.00012207031 +
                                       auVar208._0_4_ * auVar141._0_4_ * 0.00012207031;
                          fStack_1974 = auVar162._4_4_ * auVar59._4_4_ * 0.00012207031 +
                                        auVar209._4_4_ * auVar58._4_4_ * 0.00012207031 +
                                        auVar208._4_4_ * auVar141._4_4_ * 0.00012207031;
                          fStack_1970 = auVar162._8_4_ * auVar59._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar58._8_4_ * 0.00012207031 +
                                        auVar208._8_4_ * auVar141._8_4_ * 0.00012207031;
                          fStack_196c = auVar162._12_4_ * auVar59._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar58._12_4_ * 0.00012207031 +
                                        auVar208._12_4_ * auVar141._12_4_ * 0.00012207031;
                          auVar58 = vpsrld_avx(auVar153,0x10);
                          auVar58 = vcvtdq2ps_avx(auVar58);
                          local_1968 = auVar162._0_4_ * auVar58._0_4_ * 0.00012207031 +
                                       auVar209._0_4_ * auVar139._0_4_ * 0.00012207031 +
                                       auVar208._0_4_ * auVar155._0_4_ * 0.00012207031;
                          fStack_1964 = auVar162._4_4_ * auVar58._4_4_ * 0.00012207031 +
                                        auVar209._4_4_ * auVar139._4_4_ * 0.00012207031 +
                                        auVar208._4_4_ * auVar155._4_4_ * 0.00012207031;
                          fStack_1960 = auVar162._8_4_ * auVar58._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar139._8_4_ * 0.00012207031 +
                                        auVar208._8_4_ * auVar155._8_4_ * 0.00012207031;
                          fStack_195c = auVar162._12_4_ * auVar58._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar139._12_4_ * 0.00012207031 +
                                        auVar208._12_4_ * auVar155._12_4_ * 0.00012207031;
                          local_19a8 = local_1788._0_8_;
                          uStack_19a0 = local_1788._8_8_;
                          local_1998 = local_1798._0_8_;
                          uStack_1990 = local_1798._8_8_;
                          local_1988 = local_17a8._0_8_;
                          uStack_1980 = local_17a8._8_8_;
                          local_1948 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_geomID
                                                          ),0);
                          local_1958 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_primID
                                                          ),0);
                          vcmpps_avx(ZEXT1632((undefined1  [16])0x0),ZEXT1632((undefined1  [16])0x0)
                                     ,0xf);
                          uStack_1934 = context->user->instID[0];
                          local_1938 = uStack_1934;
                          uStack_1930 = uStack_1934;
                          uStack_192c = uStack_1934;
                          uStack_1928 = context->user->instPrimID[0];
                          uStack_1924 = uStack_1928;
                          uStack_1920 = uStack_1928;
                          uStack_191c = uStack_1928;
                          auVar58 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar139 = vblendvps_avx(auVar58,local_1778,auVar66);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar139;
                          args.valid = (int *)local_1b28;
                          args.geometryUserPtr = pGVar4->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_19a8;
                          args.N = 4;
                          local_1b28 = auVar66;
                          args.ray = (RTCRayN *)ray;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->occlusionFilterN)(&args);
                            auVar250 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                            auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                          }
                          if (local_1b28 == (undefined1  [16])0x0) {
                            auVar66 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar66 = auVar66 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&args);
                              auVar250 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            auVar139 = vpcmpeqd_avx(local_1b28,_DAT_01f7aa10);
                            auVar66 = auVar139 ^ _DAT_01f7ae20;
                            auVar115._8_4_ = 0xff800000;
                            auVar115._0_8_ = 0xff800000ff800000;
                            auVar115._12_4_ = 0xff800000;
                            auVar139 = vblendvps_avx(auVar115,*(undefined1 (*) [16])
                                                               (args.ray + 0x80),auVar139);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar139;
                          }
                          auVar139 = vpslld_avx(auVar66,0x1f);
                          auVar66 = vpsrad_avx(auVar139,0x1f);
                          auVar58 = vblendvps_avx(auVar58,*(undefined1 (*) [16])local_1b10,auVar139)
                          ;
                          auVar94 = ZEXT1664(auVar58);
                          *(undefined1 (*) [16])local_1b10 = auVar58;
                          auVar209 = local_1af8;
                          auVar141 = local_1af8;
                        }
                        local_1af8 = auVar209;
                        auVar100 = vandnps_avx(auVar66,auVar100);
                        auVar209 = local_1af8;
                      }
                      local_1af8 = auVar209;
                      auVar213 = ZEXT1664(auVar100);
                      if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar100[0xf]) break;
                      auVar66 = *(undefined1 (*) [16])ray;
                      auVar58 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar139 = *(undefined1 (*) [16])(ray + 0x20);
                      local_1af8 = vsubps_avx(auVar248,auVar66);
                      auVar155 = vsubps_avx(auVar103,auVar58);
                      auVar59 = vsubps_avx(auVar164,auVar139);
                      auVar162 = vsubps_avx(auVar194,auVar66);
                      auVar208 = vsubps_avx(auVar51,auVar58);
                      auVar209 = vsubps_avx(auVar78,auVar139);
                      auVar141 = vsubps_avx(auVar141,auVar66);
                      auVar58 = vsubps_avx(local_1b98,auVar58);
                      auVar139 = vsubps_avx(auVar106,auVar139);
                      auVar66 = vsubps_avx(auVar141,local_1af8);
                      auVar231 = vsubps_avx(auVar58,auVar155);
                      auVar234 = vsubps_avx(auVar139,auVar59);
                      fVar216 = auVar155._0_4_;
                      fVar99 = fVar216 + auVar58._0_4_;
                      fVar221 = auVar155._4_4_;
                      fVar177 = fVar221 + auVar58._4_4_;
                      fVar233 = auVar155._8_4_;
                      fVar203 = fVar233 + auVar58._8_4_;
                      fVar238 = auVar155._12_4_;
                      fVar204 = fVar238 + auVar58._12_4_;
                      fVar247 = auVar59._0_4_;
                      fVar190 = fVar247 + auVar139._0_4_;
                      fVar252 = auVar59._4_4_;
                      fVar49 = fVar252 + auVar139._4_4_;
                      fVar253 = auVar59._8_4_;
                      fVar68 = fVar253 + auVar139._8_4_;
                      fVar254 = auVar59._12_4_;
                      fVar205 = fVar254 + auVar139._12_4_;
                      fVar96 = auVar234._0_4_;
                      auVar211._0_4_ = fVar99 * fVar96;
                      fVar9 = auVar234._4_4_;
                      auVar211._4_4_ = fVar177 * fVar9;
                      fVar69 = auVar234._8_4_;
                      auVar211._8_4_ = fVar203 * fVar69;
                      fVar176 = auVar234._12_4_;
                      auVar211._12_4_ = fVar204 * fVar176;
                      fVar240 = auVar231._0_4_;
                      auVar225._0_4_ = fVar240 * fVar190;
                      fVar244 = auVar231._4_4_;
                      auVar225._4_4_ = fVar244 * fVar49;
                      fVar245 = auVar231._8_4_;
                      auVar225._8_4_ = fVar245 * fVar68;
                      fVar246 = auVar231._12_4_;
                      auVar225._12_4_ = fVar246 * fVar205;
                      auVar231 = vsubps_avx(auVar225,auVar211);
                      fVar6 = local_1af8._0_4_;
                      fVar207 = auVar141._0_4_ + fVar6;
                      fVar7 = local_1af8._4_4_;
                      fVar215 = auVar141._4_4_ + fVar7;
                      fVar189 = local_1af8._8_4_;
                      fVar217 = auVar141._8_4_ + fVar189;
                      fVar8 = local_1af8._12_4_;
                      fVar219 = auVar141._12_4_ + fVar8;
                      fVar202 = auVar66._0_4_;
                      auVar198._0_4_ = fVar190 * fVar202;
                      fVar190 = auVar66._4_4_;
                      auVar198._4_4_ = fVar49 * fVar190;
                      fVar161 = auVar66._8_4_;
                      auVar198._8_4_ = fVar68 * fVar161;
                      fVar11 = auVar66._12_4_;
                      auVar198._12_4_ = fVar205 * fVar11;
                      auVar226._0_4_ = fVar207 * fVar96;
                      auVar226._4_4_ = fVar215 * fVar9;
                      auVar226._8_4_ = fVar217 * fVar69;
                      auVar226._12_4_ = fVar219 * fVar176;
                      auVar234 = vsubps_avx(auVar226,auVar198);
                      auVar199._0_4_ = fVar207 * fVar240;
                      auVar199._4_4_ = fVar215 * fVar244;
                      auVar199._8_4_ = fVar217 * fVar245;
                      auVar199._12_4_ = fVar219 * fVar246;
                      auVar172._0_4_ = fVar202 * fVar99;
                      auVar172._4_4_ = fVar190 * fVar177;
                      auVar172._8_4_ = fVar161 * fVar203;
                      auVar172._12_4_ = fVar11 * fVar204;
                      auVar15 = vsubps_avx(auVar172,auVar199);
                      auVar66 = *(undefined1 (*) [16])(ray + 0x60);
                      fVar99 = auVar66._0_4_;
                      fVar204 = auVar66._4_4_;
                      fVar205 = auVar66._8_4_;
                      fVar217 = auVar66._12_4_;
                      fVar12 = *(float *)(ray + 0x50);
                      fVar13 = *(float *)(ray + 0x54);
                      fVar14 = *(float *)(ray + 0x58);
                      auVar17 = *(undefined1 (*) [12])(ray + 0x50);
                      fVar179 = *(float *)(ray + 0x5c);
                      fVar220 = *(float *)(ray + 0x40);
                      fVar227 = *(float *)(ray + 0x44);
                      fVar229 = *(float *)(ray + 0x48);
                      auVar18 = *(undefined1 (*) [12])(ray + 0x40);
                      fVar230 = *(float *)(ray + 0x4c);
                      fVar140 = fVar220 * auVar231._0_4_ +
                                fVar12 * auVar234._0_4_ + auVar15._0_4_ * fVar99;
                      fVar157 = fVar227 * auVar231._4_4_ +
                                fVar13 * auVar234._4_4_ + auVar15._4_4_ * fVar204;
                      auVar212._0_8_ = CONCAT44(fVar157,fVar140);
                      auVar212._8_4_ =
                           fVar229 * auVar231._8_4_ +
                           fVar14 * auVar234._8_4_ + auVar15._8_4_ * fVar205;
                      auVar212._12_4_ =
                           fVar230 * auVar231._12_4_ +
                           fVar179 * auVar234._12_4_ + auVar15._12_4_ * fVar217;
                      auVar66 = vsubps_avx(auVar155,auVar208);
                      auVar155 = vsubps_avx(auVar59,auVar209);
                      fVar203 = fVar216 + auVar208._0_4_;
                      fVar68 = fVar221 + auVar208._4_4_;
                      fVar215 = fVar233 + auVar208._8_4_;
                      fVar178 = fVar238 + auVar208._12_4_;
                      fVar255 = fVar247 + auVar209._0_4_;
                      fVar257 = fVar252 + auVar209._4_4_;
                      fVar258 = fVar253 + auVar209._8_4_;
                      fVar259 = fVar254 + auVar209._12_4_;
                      fVar158 = auVar155._0_4_;
                      auVar242._0_4_ = fVar158 * fVar203;
                      fVar160 = auVar155._4_4_;
                      auVar242._4_4_ = fVar160 * fVar68;
                      fVar206 = auVar155._8_4_;
                      auVar242._8_4_ = fVar206 * fVar215;
                      fVar214 = auVar155._12_4_;
                      auVar242._12_4_ = fVar214 * fVar178;
                      fVar177 = auVar66._0_4_;
                      auVar107._0_4_ = fVar255 * fVar177;
                      fVar49 = auVar66._4_4_;
                      auVar107._4_4_ = fVar257 * fVar49;
                      fVar207 = auVar66._8_4_;
                      auVar107._8_4_ = fVar258 * fVar207;
                      fVar219 = auVar66._12_4_;
                      auVar107._12_4_ = fVar259 * fVar219;
                      auVar66 = vsubps_avx(auVar107,auVar242);
                      auVar155 = vsubps_avx(local_1af8,auVar162);
                      fVar218 = auVar155._0_4_;
                      auVar256._0_4_ = fVar218 * fVar255;
                      fVar228 = auVar155._4_4_;
                      auVar256._4_4_ = fVar228 * fVar257;
                      fVar237 = auVar155._8_4_;
                      auVar256._8_4_ = fVar237 * fVar258;
                      fVar239 = auVar155._12_4_;
                      auVar256._12_4_ = fVar239 * fVar259;
                      fVar255 = fVar6 + auVar162._0_4_;
                      fVar257 = fVar7 + auVar162._4_4_;
                      fVar258 = fVar189 + auVar162._8_4_;
                      fVar259 = fVar8 + auVar162._12_4_;
                      auVar200._0_4_ = fVar158 * fVar255;
                      auVar200._4_4_ = fVar160 * fVar257;
                      auVar200._8_4_ = fVar206 * fVar258;
                      auVar200._12_4_ = fVar214 * fVar259;
                      auVar155 = vsubps_avx(auVar200,auVar256);
                      auVar183._0_4_ = fVar255 * fVar177;
                      auVar183._4_4_ = fVar257 * fVar49;
                      auVar183._8_4_ = fVar258 * fVar207;
                      auVar183._12_4_ = fVar259 * fVar219;
                      auVar173._0_4_ = fVar218 * fVar203;
                      auVar173._4_4_ = fVar228 * fVar68;
                      auVar173._8_4_ = fVar237 * fVar215;
                      auVar173._12_4_ = fVar239 * fVar178;
                      auVar59 = vsubps_avx(auVar173,auVar183);
                      auVar184._0_4_ =
                           fVar220 * auVar66._0_4_ +
                           auVar59._0_4_ * fVar99 + fVar12 * auVar155._0_4_;
                      auVar184._4_4_ =
                           fVar227 * auVar66._4_4_ +
                           auVar59._4_4_ * fVar204 + fVar13 * auVar155._4_4_;
                      auVar184._8_4_ =
                           fVar229 * auVar66._8_4_ +
                           auVar59._8_4_ * fVar205 + fVar14 * auVar155._8_4_;
                      auVar184._12_4_ =
                           fVar230 * auVar66._12_4_ +
                           auVar59._12_4_ * fVar217 + fVar179 * auVar155._12_4_;
                      auVar66 = vsubps_avx(auVar162,auVar141);
                      fVar159 = auVar162._0_4_ + auVar141._0_4_;
                      fVar180 = auVar162._4_4_ + auVar141._4_4_;
                      fVar186 = auVar162._8_4_ + auVar141._8_4_;
                      fVar187 = auVar162._12_4_ + auVar141._12_4_;
                      auVar141 = vsubps_avx(auVar208,auVar58);
                      fVar255 = auVar208._0_4_ + auVar58._0_4_;
                      fVar257 = auVar208._4_4_ + auVar58._4_4_;
                      fVar258 = auVar208._8_4_ + auVar58._8_4_;
                      fVar259 = auVar208._12_4_ + auVar58._12_4_;
                      auVar58 = vsubps_avx(auVar209,auVar139);
                      fVar188 = auVar209._0_4_ + auVar139._0_4_;
                      fVar95 = auVar209._4_4_ + auVar139._4_4_;
                      fVar97 = auVar209._8_4_ + auVar139._8_4_;
                      fVar98 = auVar209._12_4_ + auVar139._12_4_;
                      fVar203 = auVar58._0_4_;
                      auVar122._0_4_ = fVar255 * fVar203;
                      fVar68 = auVar58._4_4_;
                      auVar122._4_4_ = fVar257 * fVar68;
                      fVar215 = auVar58._8_4_;
                      auVar122._8_4_ = fVar258 * fVar215;
                      fVar178 = auVar58._12_4_;
                      auVar122._12_4_ = fVar259 * fVar178;
                      fVar120 = auVar141._0_4_;
                      auVar148._0_4_ = fVar120 * fVar188;
                      fVar131 = auVar141._4_4_;
                      auVar148._4_4_ = fVar131 * fVar95;
                      fVar132 = auVar141._8_4_;
                      auVar148._8_4_ = fVar132 * fVar97;
                      fVar133 = auVar141._12_4_;
                      auVar148._12_4_ = fVar133 * fVar98;
                      auVar58 = vsubps_avx(auVar148,auVar122);
                      fVar251 = auVar66._0_4_;
                      auVar108._0_4_ = fVar251 * fVar188;
                      fVar188 = auVar66._4_4_;
                      auVar108._4_4_ = fVar188 * fVar95;
                      fVar95 = auVar66._8_4_;
                      auVar108._8_4_ = fVar95 * fVar97;
                      fVar97 = auVar66._12_4_;
                      auVar108._12_4_ = fVar97 * fVar98;
                      auVar149._0_4_ = fVar159 * fVar203;
                      auVar149._4_4_ = fVar180 * fVar68;
                      auVar149._8_4_ = fVar186 * fVar215;
                      auVar149._12_4_ = fVar187 * fVar178;
                      auVar66 = vsubps_avx(auVar149,auVar108);
                      auVar150._8_4_ = 0x7fffffff;
                      auVar150._0_8_ = 0x7fffffff7fffffff;
                      auVar150._12_4_ = 0x7fffffff;
                      auVar86._0_4_ = fVar120 * fVar159;
                      auVar86._4_4_ = fVar131 * fVar180;
                      auVar86._8_4_ = fVar132 * fVar186;
                      auVar86._12_4_ = fVar133 * fVar187;
                      auVar60._0_4_ = fVar251 * fVar255;
                      auVar60._4_4_ = fVar188 * fVar257;
                      auVar60._8_4_ = fVar95 * fVar258;
                      auVar60._12_4_ = fVar97 * fVar259;
                      auVar139 = vsubps_avx(auVar60,auVar86);
                      auVar61._0_4_ =
                           fVar220 * auVar58._0_4_ +
                           auVar139._0_4_ * fVar99 + fVar12 * auVar66._0_4_;
                      auVar61._4_4_ =
                           fVar227 * auVar58._4_4_ +
                           auVar139._4_4_ * fVar204 + fVar13 * auVar66._4_4_;
                      auVar61._8_4_ =
                           fVar229 * auVar58._8_4_ +
                           auVar139._8_4_ * fVar205 + fVar14 * auVar66._8_4_;
                      auVar61._12_4_ =
                           fVar230 * auVar58._12_4_ +
                           auVar139._12_4_ * fVar217 + fVar179 * auVar66._12_4_;
                      auVar232._0_4_ = auVar61._0_4_ + fVar140 + auVar184._0_4_;
                      auVar232._4_4_ = auVar61._4_4_ + fVar157 + auVar184._4_4_;
                      auVar232._8_4_ = auVar61._8_4_ + auVar212._8_4_ + auVar184._8_4_;
                      auVar232._12_4_ = auVar61._12_4_ + auVar212._12_4_ + auVar184._12_4_;
                      auVar66 = vandps_avx(auVar232,auVar150);
                      auVar87._0_4_ = auVar66._0_4_ * 1.1920929e-07;
                      auVar87._4_4_ = auVar66._4_4_ * 1.1920929e-07;
                      auVar87._8_4_ = auVar66._8_4_ * 1.1920929e-07;
                      auVar87._12_4_ = auVar66._12_4_ * 1.1920929e-07;
                      auVar66 = vminps_avx(auVar212,auVar184);
                      auVar66 = vminps_avx(auVar66,auVar61);
                      uVar41 = CONCAT44(auVar87._4_4_,auVar87._0_4_);
                      auVar123._0_8_ = uVar41 ^ 0x8000000080000000;
                      auVar123._8_4_ = -auVar87._8_4_;
                      auVar123._12_4_ = -auVar87._12_4_;
                      auVar66 = vcmpps_avx(auVar66,auVar123,5);
                      auVar58 = vmaxps_avx(auVar212,auVar184);
                      auVar58 = vmaxps_avx(auVar58,auVar61);
                      auVar58 = vcmpps_avx(auVar58,auVar87,2);
                      auVar66 = vorps_avx(auVar66,auVar58);
                      auVar58 = auVar100 & auVar66;
                      auVar66 = vandps_avx(auVar66,auVar100);
                      if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar58[0xf] < '\0') {
                        auVar62._0_4_ = fVar177 * fVar96;
                        auVar62._4_4_ = fVar49 * fVar9;
                        auVar62._8_4_ = fVar207 * fVar69;
                        auVar62._12_4_ = fVar219 * fVar176;
                        auVar88._0_4_ = fVar240 * fVar158;
                        auVar88._4_4_ = fVar244 * fVar160;
                        auVar88._8_4_ = fVar245 * fVar206;
                        auVar88._12_4_ = fVar246 * fVar214;
                        auVar141 = vsubps_avx(auVar88,auVar62);
                        auVar109._0_4_ = fVar120 * fVar158;
                        auVar109._4_4_ = fVar131 * fVar160;
                        auVar109._8_4_ = fVar132 * fVar206;
                        auVar109._12_4_ = fVar133 * fVar214;
                        auVar124._0_4_ = fVar177 * fVar203;
                        auVar124._4_4_ = fVar49 * fVar68;
                        auVar124._8_4_ = fVar207 * fVar215;
                        auVar124._12_4_ = fVar219 * fVar178;
                        auVar155 = vsubps_avx(auVar124,auVar109);
                        auVar58 = vandps_avx(auVar62,auVar150);
                        auVar139 = vandps_avx(auVar109,auVar150);
                        auVar58 = vcmpps_avx(auVar58,auVar139,1);
                        auVar141 = vblendvps_avx(auVar155,auVar141,auVar58);
                        auVar63._0_4_ = fVar218 * fVar203;
                        auVar63._4_4_ = fVar228 * fVar68;
                        auVar63._8_4_ = fVar237 * fVar215;
                        auVar63._12_4_ = fVar239 * fVar178;
                        auVar89._0_4_ = fVar218 * fVar96;
                        auVar89._4_4_ = fVar228 * fVar9;
                        auVar89._8_4_ = fVar237 * fVar69;
                        auVar89._12_4_ = fVar239 * fVar176;
                        auVar110._0_4_ = fVar158 * fVar202;
                        auVar110._4_4_ = fVar160 * fVar190;
                        auVar110._8_4_ = fVar206 * fVar161;
                        auVar110._12_4_ = fVar214 * fVar11;
                        auVar155 = vsubps_avx(auVar89,auVar110);
                        auVar137._0_4_ = fVar251 * fVar158;
                        auVar137._4_4_ = fVar188 * fVar160;
                        auVar137._8_4_ = fVar95 * fVar206;
                        auVar137._12_4_ = fVar97 * fVar214;
                        auVar59 = vsubps_avx(auVar137,auVar63);
                        auVar58 = vandps_avx(auVar110,auVar150);
                        auVar139 = vandps_avx(auVar63,auVar150);
                        auVar58 = vcmpps_avx(auVar58,auVar139,1);
                        auVar155 = vblendvps_avx(auVar59,auVar155,auVar58);
                        auVar64._0_4_ = fVar251 * fVar177;
                        auVar64._4_4_ = fVar188 * fVar49;
                        auVar64._8_4_ = fVar95 * fVar207;
                        auVar64._12_4_ = fVar97 * fVar219;
                        auVar111._0_4_ = fVar177 * fVar202;
                        auVar111._4_4_ = fVar49 * fVar190;
                        auVar111._8_4_ = fVar207 * fVar161;
                        auVar111._12_4_ = fVar219 * fVar11;
                        auVar138._0_4_ = fVar218 * fVar240;
                        auVar138._4_4_ = fVar228 * fVar244;
                        auVar138._8_4_ = fVar237 * fVar245;
                        auVar138._12_4_ = fVar239 * fVar246;
                        auVar151._0_4_ = fVar218 * fVar120;
                        auVar151._4_4_ = fVar228 * fVar131;
                        auVar151._8_4_ = fVar237 * fVar132;
                        auVar151._12_4_ = fVar239 * fVar133;
                        auVar59 = vsubps_avx(auVar111,auVar138);
                        auVar162 = vsubps_avx(auVar151,auVar64);
                        auVar58 = vandps_avx(auVar150,auVar138);
                        auVar139 = vandps_avx(auVar150,auVar64);
                        auVar58 = vcmpps_avx(auVar58,auVar139,1);
                        auVar139 = vblendvps_avx(auVar162,auVar59,auVar58);
                        local_1b88 = auVar17._0_4_;
                        fStack_1b84 = auVar17._4_4_;
                        fStack_1b80 = auVar17._8_4_;
                        local_1b48 = auVar18._0_4_;
                        fStack_1b44 = auVar18._4_4_;
                        fStack_1b40 = auVar18._8_4_;
                        fVar96 = auVar141._0_4_ * local_1b48 +
                                 auVar139._0_4_ * fVar99 + auVar155._0_4_ * local_1b88;
                        fVar202 = auVar141._4_4_ * fStack_1b44 +
                                  auVar139._4_4_ * fVar204 + auVar155._4_4_ * fStack_1b84;
                        fVar99 = auVar141._8_4_ * fStack_1b40 +
                                 auVar139._8_4_ * fVar205 + auVar155._8_4_ * fStack_1b80;
                        fVar177 = auVar141._12_4_ * fVar230 +
                                  auVar139._12_4_ * fVar217 + auVar155._12_4_ * fVar179;
                        auVar65._0_4_ = fVar96 + fVar96;
                        auVar65._4_4_ = fVar202 + fVar202;
                        auVar65._8_4_ = fVar99 + fVar99;
                        auVar65._12_4_ = fVar177 + fVar177;
                        fVar96 = auVar141._0_4_ * fVar6 +
                                 auVar139._0_4_ * fVar247 + auVar155._0_4_ * fVar216;
                        fVar202 = auVar141._4_4_ * fVar7 +
                                  auVar139._4_4_ * fVar252 + auVar155._4_4_ * fVar221;
                        fVar99 = auVar141._8_4_ * fVar189 +
                                 auVar139._8_4_ * fVar253 + auVar155._8_4_ * fVar233;
                        fVar177 = auVar141._12_4_ * fVar8 +
                                  auVar139._12_4_ * fVar254 + auVar155._12_4_ * fVar238;
                        auVar58 = vrcpps_avx(auVar65);
                        fVar6 = auVar58._0_4_;
                        auVar185._0_4_ = auVar65._0_4_ * fVar6;
                        fVar7 = auVar58._4_4_;
                        auVar185._4_4_ = auVar65._4_4_ * fVar7;
                        fVar189 = auVar58._8_4_;
                        auVar185._8_4_ = auVar65._8_4_ * fVar189;
                        fVar8 = auVar58._12_4_;
                        auVar185._12_4_ = auVar65._12_4_ * fVar8;
                        auVar201._8_4_ = 0x3f800000;
                        auVar201._0_8_ = 0x3f8000003f800000;
                        auVar201._12_4_ = 0x3f800000;
                        auVar58 = vsubps_avx(auVar201,auVar185);
                        auVar112._0_4_ = (fVar96 + fVar96) * (fVar6 + fVar6 * auVar58._0_4_);
                        auVar112._4_4_ = (fVar202 + fVar202) * (fVar7 + fVar7 * auVar58._4_4_);
                        auVar112._8_4_ = (fVar99 + fVar99) * (fVar189 + fVar189 * auVar58._8_4_);
                        auVar112._12_4_ = (fVar177 + fVar177) * (fVar8 + fVar8 * auVar58._12_4_);
                        auVar58 = vcmpps_avx(auVar112,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar59 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar112,2);
                        auVar58 = vandps_avx(auVar59,auVar58);
                        auVar59 = vcmpps_avx(auVar65,_DAT_01f7aa10,4);
                        auVar58 = vandps_avx(auVar59,auVar58);
                        auVar58 = vpslld_avx(auVar58,0x1f);
                        auVar59 = vpsrad_avx(auVar58,0x1f);
                        auVar58 = auVar66 & auVar59;
                        auVar66 = vandps_avx(auVar66,auVar59);
                        if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar58[0xf] < '\0') {
                          uStack_1b50 = auVar212._8_8_;
                          uStack_17b0 = uStack_1b50;
                          local_1818 = auVar139;
                          local_1808 = auVar155;
                          local_17f8 = auVar141;
                          local_17e8 = auVar112;
                          local_17d8 = auVar232;
                          _local_17c8 = auVar184;
                          local_17b8 = auVar212._0_8_;
                        }
                      }
                      auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar250 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      pGVar4 = (context->scene->geometries).items
                               [(pre.super_Precalculations.grid)->_geomID].ptr;
                      uVar1 = pGVar4->mask;
                      auVar90._4_4_ = uVar1;
                      auVar90._0_4_ = uVar1;
                      auVar90._8_4_ = uVar1;
                      auVar90._12_4_ = uVar1;
                      auVar58 = vandps_avx(auVar90,*(undefined1 (*) [16])(ray + 0x90));
                      auVar58 = vpcmpeqd_avx(auVar58,_DAT_01f7aa10);
                      auVar94 = ZEXT1664(auVar58);
                      auVar139 = auVar66 & ~auVar58;
                      if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar139 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar139 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar139[0xf] < '\0') {
                        auVar66 = vandnps_avx(auVar58,auVar66);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar58 = vandps_avx(local_17d8,auVar150);
                          auVar139 = vrcpps_avx(local_17d8);
                          fVar6 = auVar139._0_4_;
                          auVar128._0_4_ = local_17d8._0_4_ * fVar6;
                          fVar7 = auVar139._4_4_;
                          auVar128._4_4_ = local_17d8._4_4_ * fVar7;
                          fVar189 = auVar139._8_4_;
                          auVar128._8_4_ = local_17d8._8_4_ * fVar189;
                          fVar8 = auVar139._12_4_;
                          auVar128._12_4_ = local_17d8._12_4_ * fVar8;
                          auVar175._8_4_ = 0x3f800000;
                          auVar175._0_8_ = 0x3f8000003f800000;
                          auVar175._12_4_ = 0x3f800000;
                          auVar139 = vsubps_avx(auVar175,auVar128);
                          auVar116._0_4_ = fVar6 + fVar6 * auVar139._0_4_;
                          auVar116._4_4_ = fVar7 + fVar7 * auVar139._4_4_;
                          auVar116._8_4_ = fVar189 + fVar189 * auVar139._8_4_;
                          auVar116._12_4_ = fVar8 + fVar8 * auVar139._12_4_;
                          auVar129._8_4_ = 0x219392ef;
                          auVar129._0_8_ = 0x219392ef219392ef;
                          auVar129._12_4_ = 0x219392ef;
                          auVar58 = vcmpps_avx(auVar58,auVar129,5);
                          auVar58 = vandps_avx(auVar58,auVar116);
                          auVar92._0_4_ = auVar58._0_4_ * (float)local_17b8;
                          auVar92._4_4_ = auVar58._4_4_ * local_17b8._4_4_;
                          auVar92._8_4_ = auVar58._8_4_ * (float)uStack_17b0;
                          auVar92._12_4_ = auVar58._12_4_ * uStack_17b0._4_4_;
                          auVar162 = vminps_avx(auVar92,auVar175);
                          auVar117._0_4_ = auVar58._0_4_ * (float)local_17c8._0_4_;
                          auVar117._4_4_ = auVar58._4_4_ * (float)local_17c8._4_4_;
                          auVar117._8_4_ = auVar58._8_4_ * fStack_17c0;
                          auVar117._12_4_ = auVar58._12_4_ * fStack_17bc;
                          auVar208 = vminps_avx(auVar117,auVar175);
                          uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar20 + -0x30);
                          auVar130._4_4_ = uVar37;
                          auVar130._0_4_ = uVar37;
                          auVar130._8_4_ = uVar37;
                          auVar130._12_4_ = uVar37;
                          auVar139 = vpsrld_avx(auVar130,0x10);
                          auVar59 = ZEXT816(0) << 0x40;
                          auVar58 = vpblendw_avx(auVar130,auVar59,0xaa);
                          auVar58 = vcvtdq2ps_avx(auVar58);
                          auVar139 = vcvtdq2ps_avx(auVar139);
                          uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar20 + -0x2c);
                          auVar154._4_4_ = uVar37;
                          auVar154._0_4_ = uVar37;
                          auVar154._8_4_ = uVar37;
                          auVar154._12_4_ = uVar37;
                          auVar141 = vsubps_avx(auVar175,auVar162);
                          auVar209 = vsubps_avx(auVar141,auVar208);
                          auVar141 = vpblendw_avx(auVar154,auVar59,0xaa);
                          auVar141 = vcvtdq2ps_avx(auVar141);
                          auVar155 = vpsrld_avx(auVar154,0x10);
                          auVar155 = vcvtdq2ps_avx(auVar155);
                          uVar37 = *(undefined4 *)(pGVar30->data + lVar44 + lVar27 + -0x30);
                          auVar156._4_4_ = uVar37;
                          auVar156._0_4_ = uVar37;
                          auVar156._8_4_ = uVar37;
                          auVar156._12_4_ = uVar37;
                          auVar59 = vpblendw_avx(auVar156,auVar59,0xaa);
                          auVar59 = vcvtdq2ps_avx(auVar59);
                          local_1978 = auVar162._0_4_ * auVar59._0_4_ * 0.00012207031 +
                                       auVar209._0_4_ * auVar58._0_4_ * 0.00012207031 +
                                       auVar208._0_4_ * auVar141._0_4_ * 0.00012207031;
                          fStack_1974 = auVar162._4_4_ * auVar59._4_4_ * 0.00012207031 +
                                        auVar209._4_4_ * auVar58._4_4_ * 0.00012207031 +
                                        auVar208._4_4_ * auVar141._4_4_ * 0.00012207031;
                          fStack_1970 = auVar162._8_4_ * auVar59._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar58._8_4_ * 0.00012207031 +
                                        auVar208._8_4_ * auVar141._8_4_ * 0.00012207031;
                          fStack_196c = auVar162._12_4_ * auVar59._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar58._12_4_ * 0.00012207031 +
                                        auVar208._12_4_ * auVar141._12_4_ * 0.00012207031;
                          auVar58 = vpsrld_avx(auVar156,0x10);
                          auVar58 = vcvtdq2ps_avx(auVar58);
                          local_1968 = auVar162._0_4_ * auVar58._0_4_ * 0.00012207031 +
                                       auVar209._0_4_ * auVar139._0_4_ * 0.00012207031 +
                                       auVar208._0_4_ * auVar155._0_4_ * 0.00012207031;
                          fStack_1964 = auVar162._4_4_ * auVar58._4_4_ * 0.00012207031 +
                                        auVar209._4_4_ * auVar139._4_4_ * 0.00012207031 +
                                        auVar208._4_4_ * auVar155._4_4_ * 0.00012207031;
                          fStack_1960 = auVar162._8_4_ * auVar58._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar139._8_4_ * 0.00012207031 +
                                        auVar208._8_4_ * auVar155._8_4_ * 0.00012207031;
                          fStack_195c = auVar162._12_4_ * auVar58._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar139._12_4_ * 0.00012207031 +
                                        auVar208._12_4_ * auVar155._12_4_ * 0.00012207031;
                          local_19a8 = local_17f8._0_8_;
                          uStack_19a0 = local_17f8._8_8_;
                          local_1998 = local_1808._0_8_;
                          uStack_1990 = local_1808._8_8_;
                          local_1988 = local_1818._0_8_;
                          uStack_1980 = local_1818._8_8_;
                          local_1948 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_geomID
                                                          ),0);
                          local_1958 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->_primID
                                                          ),0);
                          vcmpps_avx(ZEXT1632((undefined1  [16])0x0),ZEXT1632((undefined1  [16])0x0)
                                     ,0xf);
                          uStack_1934 = context->user->instID[0];
                          local_1938 = uStack_1934;
                          uStack_1930 = uStack_1934;
                          uStack_192c = uStack_1934;
                          uStack_1928 = context->user->instPrimID[0];
                          uStack_1924 = uStack_1928;
                          uStack_1920 = uStack_1928;
                          uStack_191c = uStack_1928;
                          auVar58 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar139 = vblendvps_avx(auVar58,local_17e8,auVar66);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar139;
                          args.valid = (int *)local_1b28;
                          args.geometryUserPtr = pGVar4->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_19a8;
                          args.N = 4;
                          local_1b28 = auVar66;
                          args.ray = (RTCRayN *)ray;
                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar4->occlusionFilterN)(&args);
                            auVar250 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                            auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                          }
                          if (local_1b28 == (undefined1  [16])0x0) {
                            auVar66 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar66 = auVar66 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var5)(&args);
                              auVar250 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                            }
                            auVar139 = vpcmpeqd_avx(local_1b28,_DAT_01f7aa10);
                            auVar66 = auVar139 ^ _DAT_01f7ae20;
                            auVar118._8_4_ = 0xff800000;
                            auVar118._0_8_ = 0xff800000ff800000;
                            auVar118._12_4_ = 0xff800000;
                            auVar139 = vblendvps_avx(auVar118,*(undefined1 (*) [16])
                                                               (args.ray + 0x80),auVar139);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar139;
                          }
                          auVar139 = vpslld_avx(auVar66,0x1f);
                          auVar66 = vpsrad_avx(auVar139,0x1f);
                          auVar58 = vblendvps_avx(auVar58,*(undefined1 (*) [16])local_1b10,auVar139)
                          ;
                          auVar94 = ZEXT1664(auVar58);
                          *(undefined1 (*) [16])local_1b10 = auVar58;
                        }
                        auVar100 = vpandn_avx(auVar66,auVar100);
                      }
                      auVar213 = ZEXT1664(auVar100);
                      lVar44 = lVar44 + 4;
                    } while ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              || (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar100 >> 0x5f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) || auVar100[0xf] < '\0');
                    lVar44 = 1;
                    uVar35 = 0;
                  } while (((byte)local_1afc & uVar3 != 2) != 0);
                  auVar66 = vpcmpeqd_avx(auVar94._0_16_,auVar94._0_16_);
                  auVar67 = auVar213._0_16_ ^ auVar66;
                  sVar36 = 0;
                }
                else {
                  pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                  sVar36 = *(size_t *)
                            ((pre.super_Precalculations.grid)->data +
                            (pre.super_Precalculations.grid)->rootOffset);
                  auVar67._8_8_ = uVar29;
                  auVar67._0_8_ = uVar28;
                  auVar66 = vpcmpeqd_avx(auVar58,auVar58);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx(auVar67,(undefined1  [16])terminated.field_0);
                auVar66 = auVar66 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar66[0xf]) goto LAB_01522c26;
                auVar119._8_4_ = 0xff800000;
                auVar119._0_8_ = 0xff800000ff800000;
                auVar119._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar119,
                                   (undefined1  [16])terminated.field_0);
                if (sVar36 != 0) {
                  pNVar48->ptr = sVar36;
                  pNVar48 = pNVar48 + 1;
                  paVar47->i[0] = -0x800000;
                  paVar47->i[1] = -0x800000;
                  paVar47->i[2] = -0x800000;
                  paVar47->i[3] = -0x800000;
                  paVar47 = paVar47 + 1;
                }
              }
              goto LAB_015215a0;
            }
            lVar38 = 0;
            sVar36 = 8;
            auVar66 = auVar236._0_16_;
            do {
              sVar42 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar38 * 8);
              if (sVar42 == 8) {
                auVar94 = ZEXT1664(auVar66);
                sVar42 = sVar36;
                break;
              }
              uVar37 = *(undefined4 *)(root.ptr + 0x20 + lVar38 * 4);
              auVar70._4_4_ = uVar37;
              auVar70._0_4_ = uVar37;
              auVar70._8_4_ = uVar37;
              auVar70._12_4_ = uVar37;
              auVar100._8_8_ = tray.org.field_0._8_8_;
              auVar100._0_8_ = tray.org.field_0._0_8_;
              auVar15._8_8_ = tray.org.field_0._24_8_;
              auVar15._0_8_ = tray.org.field_0._16_8_;
              auVar16._8_8_ = tray.org.field_0._40_8_;
              auVar16._0_8_ = tray.org.field_0._32_8_;
              auVar58 = vsubps_avx(auVar70,auVar100);
              auVar163._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar58._0_4_;
              auVar163._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar58._4_4_;
              auVar163._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar58._8_4_;
              auVar163._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar58._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x40 + lVar38 * 4);
              auVar71._4_4_ = uVar37;
              auVar71._0_4_ = uVar37;
              auVar71._8_4_ = uVar37;
              auVar71._12_4_ = uVar37;
              auVar58 = vsubps_avx(auVar71,auVar15);
              auVar191._0_4_ = tray.rdir.field_0._16_4_ * auVar58._0_4_;
              auVar191._4_4_ = tray.rdir.field_0._20_4_ * auVar58._4_4_;
              auVar191._8_4_ = tray.rdir.field_0._24_4_ * auVar58._8_4_;
              auVar191._12_4_ = tray.rdir.field_0._28_4_ * auVar58._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x60 + lVar38 * 4);
              auVar72._4_4_ = uVar37;
              auVar72._0_4_ = uVar37;
              auVar72._8_4_ = uVar37;
              auVar72._12_4_ = uVar37;
              auVar58 = vsubps_avx(auVar72,auVar16);
              auVar222._0_4_ = tray.rdir.field_0._32_4_ * auVar58._0_4_;
              auVar222._4_4_ = tray.rdir.field_0._36_4_ * auVar58._4_4_;
              auVar222._8_4_ = tray.rdir.field_0._40_4_ * auVar58._8_4_;
              auVar222._12_4_ = tray.rdir.field_0._44_4_ * auVar58._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x30 + lVar38 * 4);
              auVar73._4_4_ = uVar37;
              auVar73._0_4_ = uVar37;
              auVar73._8_4_ = uVar37;
              auVar73._12_4_ = uVar37;
              auVar58 = vsubps_avx(auVar73,auVar100);
              auVar101._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar58._0_4_;
              auVar101._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar58._4_4_;
              auVar101._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar58._8_4_;
              auVar101._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar58._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x50 + lVar38 * 4);
              auVar74._4_4_ = uVar37;
              auVar74._0_4_ = uVar37;
              auVar74._8_4_ = uVar37;
              auVar74._12_4_ = uVar37;
              auVar58 = vsubps_avx(auVar74,auVar15);
              auVar121._0_4_ = tray.rdir.field_0._16_4_ * auVar58._0_4_;
              auVar121._4_4_ = tray.rdir.field_0._20_4_ * auVar58._4_4_;
              auVar121._8_4_ = tray.rdir.field_0._24_4_ * auVar58._8_4_;
              auVar121._12_4_ = tray.rdir.field_0._28_4_ * auVar58._12_4_;
              uVar37 = *(undefined4 *)(root.ptr + 0x70 + lVar38 * 4);
              auVar75._4_4_ = uVar37;
              auVar75._0_4_ = uVar37;
              auVar75._8_4_ = uVar37;
              auVar75._12_4_ = uVar37;
              auVar58 = vsubps_avx(auVar75,auVar16);
              auVar134._0_4_ = tray.rdir.field_0._32_4_ * auVar58._0_4_;
              auVar134._4_4_ = tray.rdir.field_0._36_4_ * auVar58._4_4_;
              auVar134._8_4_ = tray.rdir.field_0._40_4_ * auVar58._8_4_;
              auVar134._12_4_ = tray.rdir.field_0._44_4_ * auVar58._12_4_;
              auVar58 = vminps_avx(auVar163,auVar101);
              auVar139 = vminps_avx(auVar191,auVar121);
              auVar58 = vmaxps_avx(auVar58,auVar139);
              auVar139 = vminps_avx(auVar222,auVar134);
              auVar58 = vmaxps_avx(auVar58,auVar139);
              auVar76._0_4_ = auVar243._0_4_ * auVar58._0_4_;
              auVar76._4_4_ = auVar243._4_4_ * auVar58._4_4_;
              auVar76._8_4_ = auVar243._8_4_ * auVar58._8_4_;
              auVar76._12_4_ = auVar243._12_4_ * auVar58._12_4_;
              auVar58 = vmaxps_avx(auVar163,auVar101);
              auVar139 = vmaxps_avx(auVar191,auVar121);
              auVar139 = vminps_avx(auVar58,auVar139);
              auVar58 = vmaxps_avx(auVar222,auVar134);
              auVar58 = vminps_avx(auVar139,auVar58);
              auVar102._0_4_ = auVar250._0_4_ * auVar58._0_4_;
              auVar102._4_4_ = auVar250._4_4_ * auVar58._4_4_;
              auVar102._8_4_ = auVar250._8_4_ * auVar58._8_4_;
              auVar102._12_4_ = auVar250._12_4_ * auVar58._12_4_;
              auVar58 = vmaxps_avx(auVar76,(undefined1  [16])tray.tnear.field_0);
              auVar139 = vminps_avx(auVar102,(undefined1  [16])tray.tfar.field_0);
              auVar58 = vcmpps_avx(auVar58,auVar139,2);
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar58[0xf]) {
                auVar94 = ZEXT1664(auVar66);
                sVar42 = sVar36;
              }
              else {
                auVar58 = vblendvps_avx(auVar236._0_16_,auVar76,auVar58);
                auVar94 = ZEXT1664(auVar58);
                if (sVar36 != 8) {
                  pNVar48->ptr = sVar36;
                  pNVar48 = pNVar48 + 1;
                  *(undefined1 (*) [16])paVar47->v = auVar66;
                  paVar47 = paVar47 + 1;
                }
              }
              lVar38 = lVar38 + 1;
              auVar66 = auVar94._0_16_;
              sVar36 = sVar42;
            } while (lVar38 != 4);
            iVar33 = 4;
            if (sVar42 == 8) goto LAB_01521767;
            auVar66 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar94._0_16_,6);
            uVar37 = vmovmskps_avx(auVar66);
            root.ptr = sVar42;
          } while ((byte)uVar45 < (byte)POPCOUNT(uVar37));
          pNVar48->ptr = sVar42;
          pNVar48 = pNVar48 + 1;
          *paVar47 = auVar94._0_16_;
          paVar47 = paVar47 + 1;
        }
        else {
          do {
            sVar36 = 0;
            if (uVar41 != 0) {
              for (; (uVar41 >> sVar36 & 1) == 0; sVar36 = sVar36 + 1) {
              }
            }
            bVar31 = occluded1(This,bvh,root,sVar36,&pre,ray,&tray,context);
            if (bVar31) {
              terminated.field_0.i[sVar36] = -1;
            }
            uVar41 = uVar41 & uVar41 - 1;
          } while (uVar41 != 0);
          auVar66 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar66[0xf]) {
            iVar33 = 3;
          }
          else {
            auVar66._8_4_ = 0xff800000;
            auVar66._0_8_ = 0xff800000ff800000;
            auVar66._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar66,
                               (undefined1  [16])terminated.field_0);
            iVar33 = 2;
          }
          auVar236 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar243 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar250 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar94 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar45 < uVar32) goto LAB_015215de;
        }
LAB_01521767:
      } while ((iVar33 == 4) || (iVar33 == 2));
LAB_01522c26:
      auVar10 = vandps_avx(auVar10,(undefined1  [16])terminated.field_0);
      auVar93._8_4_ = 0xff800000;
      auVar93._0_8_ = 0xff800000ff800000;
      auVar93._12_4_ = 0xff800000;
      auVar10 = vmaskmovps_avx(auVar10,auVar93);
      *(undefined1 (*) [16])local_1b10 = auVar10;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }